

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result spvc_compiler_create_shader_resources(spvc_compiler compiler,spvc_resources *resources)

{
  spvc_context psVar1;
  size_t sVar2;
  bool bVar3;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> this;
  spvc_result sVar4;
  ShaderResources accessed_resources;
  undefined1 *local_1a88 [2];
  undefined1 local_1a78 [16];
  undefined1 *local_1a68 [2];
  undefined1 local_1a58 [48];
  ShaderResources local_1a28;
  
  this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)
       operator_new(0xe10,(nothrow_t *)&std::nothrow);
  if (this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl ==
      (ScratchMemoryAllocation *)0x0) {
    psVar1 = compiler->context;
    local_1a68[0] = local_1a58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a68,"Out of memory.","");
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a68);
    if (psVar1->callback != (spvc_error_callback)0x0) {
      (*psVar1->callback)(psVar1->callback_userdata,(psVar1->last_error)._M_dataplus._M_p);
    }
    sVar4 = SPVC_ERROR_OUT_OF_MEMORY;
    if (local_1a68[0] != local_1a58) {
      operator_delete(local_1a68[0]);
    }
  }
  else {
    *(undefined ***)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
         &PTR__spvc_resources_s_0048fab0;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xf0) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xe8))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x100);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xf8) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x1c8) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x1c0))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x1d8);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x1d0) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x2a0) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x298))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x2b0);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x2a8) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x378) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x370))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x388);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x380) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x450) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x448))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x460);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x458) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x528) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x520))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x538);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x530) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x600) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x5f8))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x610);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x608) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x6d8) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x6d0))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x6e8);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x6e0) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x7b0) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x7a8))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x7c0);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x7b8) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x888) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x880))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x898);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x890) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x960) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x958))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x970);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x968) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xa38) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xa30))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xa48);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xa40) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xb10) = 0;
    (((SmallVector<spvc_reflected_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xb08))->
    super_VectorView<spvc_reflected_resource>).ptr =
         (spvc_reflected_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xb20);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xb18) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xbe8) = 0;
    (((SmallVector<spvc_reflected_builtin_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xbe0))->
    super_VectorView<spvc_reflected_builtin_resource>).ptr =
         (spvc_reflected_builtin_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xbf8);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xbf0) = 8;
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xd00) = 0;
    (((SmallVector<spvc_reflected_builtin_resource,_8UL> *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xcf8))->
    super_VectorView<spvc_reflected_builtin_resource>).ptr =
         (spvc_reflected_builtin_resource *)
         ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xd10);
    *(size_t *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xd08) = 8;
    *(spvc_context *)
     ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
         compiler->context;
    spirv_cross::Compiler::get_shader_resources
              (&local_1a28,
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
    bVar3 = spvc_resources_s::copy_resources
                      ((spvc_resources_s *)
                       this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl,
                       &local_1a28);
    if (bVar3) {
      *resources = (spvc_resources)
                   this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
      psVar1 = compiler->context;
      spirv_cross::
      SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
      ::reserve(&psVar1->allocations,
                (psVar1->allocations).
                super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
                .buffer_size + 1);
      sVar2 = (psVar1->allocations).
              super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
              .buffer_size;
      (psVar1->allocations).
      super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
      .ptr[sVar2]._M_t.
      super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>.
      _M_t.
      super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
      .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
           this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
      (psVar1->allocations).
      super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
      .buffer_size = sVar2 + 1;
      spirv_cross::ShaderResources::~ShaderResources(&local_1a28);
      sVar4 = SPVC_SUCCESS;
    }
    else {
      psVar1 = *(spvc_context *)
                ((long)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8
                );
      local_1a88[0] = local_1a78;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a88,"Out of memory.","");
      std::__cxx11::string::operator=((string *)psVar1,(string *)local_1a88);
      if (psVar1->callback != (spvc_error_callback)0x0) {
        (*psVar1->callback)(psVar1->callback_userdata,(psVar1->last_error)._M_dataplus._M_p);
      }
      if (local_1a88[0] != local_1a78) {
        operator_delete(local_1a88[0]);
      }
      spirv_cross::ShaderResources::~ShaderResources(&local_1a28);
      (*(*(_func_int ***)this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl)
        [1])(this.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl);
      sVar4 = SPVC_ERROR_OUT_OF_MEMORY;
    }
  }
  return sVar4;
}

Assistant:

spvc_result spvc_compiler_create_shader_resources(spvc_compiler compiler, spvc_resources *resources)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_resources_s> res(new (std::nothrow) spvc_resources_s);
		if (!res)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		res->context = compiler->context;
		auto accessed_resources = compiler->compiler->get_shader_resources();

		if (!res->copy_resources(accessed_resources))
		{
			res->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		*resources = res.get();
		compiler->context->allocations.push_back(std::move(res));
	}